

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

void __thiscall
btQuantizedBvh::setQuantizationValues
          (btQuantizedBvh *this,btVector3 *bvhAabbMin,btVector3 *bvhAabbMax,
          btScalar quantizationMargin)

{
  btVector3 *in_RDI;
  btVector3 bVar1;
  btVector3 v;
  unsigned_short vecIn [3];
  btVector3 aabbSize;
  btVector3 clampValue;
  btVector3 *in_stack_fffffffffffffe88;
  btVector3 *v2;
  btVector3 *in_stack_fffffffffffffe90;
  btVector3 *this_00;
  btScalar *vecIn_00;
  btQuantizedBvh *in_stack_fffffffffffffeb0;
  int isMax;
  undefined4 in_stack_fffffffffffffec8;
  btScalar in_stack_fffffffffffffecc;
  btScalar in_stack_fffffffffffffed0;
  btScalar in_stack_fffffffffffffed4;
  btVector3 local_128 [2];
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 local_f0;
  btScalar local_e8 [2];
  btScalar abStack_e0 [2];
  undefined8 local_d8;
  undefined8 local_d0;
  btScalar local_c8 [2];
  btScalar abStack_c0 [2];
  btVector3 local_b8;
  undefined1 local_9a [14];
  btScalar local_8c;
  btVector3 local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined8 local_3c;
  undefined8 uStack_34;
  btVector3 local_2c;
  btScalar local_1c [7];
  
  btVector3::btVector3(&local_2c,local_1c,local_1c,local_1c);
  bVar1 = operator-(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  uStack_34 = bVar1.m_floats._8_8_;
  local_3c = bVar1.m_floats._0_8_;
  vecIn_00 = in_RDI->m_floats + 2;
  *(undefined8 *)(in_RDI->m_floats + 2) = local_3c;
  *(undefined8 *)in_RDI[1].m_floats = uStack_34;
  bVar1 = operator+(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  uStack_44 = bVar1.m_floats._8_8_;
  local_4c = bVar1.m_floats._0_8_;
  *(undefined8 *)(in_RDI[1].m_floats + 2) = local_4c;
  *(undefined8 *)in_RDI[2].m_floats = uStack_44;
  bVar1 = operator-(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  uStack_60 = bVar1.m_floats._8_8_;
  local_68 = bVar1.m_floats._0_8_;
  local_8c = 65533.0;
  local_9a._10_4_ = 0x477ffd00;
  local_9a._6_4_ = 0x477ffd00;
  btVector3::btVector3(&local_88,&local_8c,(btScalar *)(local_9a + 10),(btScalar *)(local_9a + 6));
  isMax = (int)((ulong)&local_68 >> 0x20);
  bVar1 = operator/(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  uStack_70 = bVar1.m_floats._8_8_;
  local_78 = bVar1.m_floats._0_8_;
  *(undefined8 *)(in_RDI[2].m_floats + 2) = local_78;
  *(undefined8 *)in_RDI[3].m_floats = uStack_70;
  *(undefined1 *)in_RDI[4].m_floats = 1;
  this_00 = &local_b8;
  btVector3::btVector3(this_00);
  v2 = (btVector3 *)local_9a;
  quantize((btQuantizedBvh *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
           (unsigned_short *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),in_RDI,
           isMax);
  bVar1 = unQuantize(in_stack_fffffffffffffeb0,(unsigned_short *)vecIn_00);
  abStack_c0 = bVar1.m_floats._8_8_;
  local_c8 = bVar1.m_floats._0_8_;
  local_b8.m_floats._0_8_ = local_c8;
  local_b8.m_floats._8_8_ = abStack_c0;
  bVar1 = operator-(this_00,v2);
  local_d0 = bVar1.m_floats._8_8_;
  local_d8 = bVar1.m_floats._0_8_;
  btVector3::setMin(this_00,v2);
  quantize((btQuantizedBvh *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
           (unsigned_short *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),in_RDI,
           isMax);
  bVar1 = unQuantize(in_stack_fffffffffffffeb0,(unsigned_short *)vecIn_00);
  abStack_e0 = bVar1.m_floats._8_8_;
  local_e8 = bVar1.m_floats._0_8_;
  local_b8.m_floats._0_8_ = local_e8;
  local_b8.m_floats._8_8_ = abStack_e0;
  bVar1 = operator+(this_00,v2);
  local_f0 = bVar1.m_floats._8_8_;
  local_f8 = bVar1.m_floats._0_8_;
  btVector3::setMax(this_00,v2);
  bVar1 = operator-(this_00,v2);
  uStack_100 = bVar1.m_floats._8_8_;
  local_108 = bVar1.m_floats._0_8_;
  local_68 = local_108;
  uStack_60 = uStack_100;
  btVector3::btVector3
            (local_128,(btScalar *)&stack0xfffffffffffffed4,(btScalar *)&stack0xfffffffffffffed0,
             (btScalar *)&stack0xfffffffffffffecc);
  bVar1 = operator/(this_00,v2);
  *(long *)(in_RDI[2].m_floats + 2) = bVar1.m_floats._0_8_;
  *(long *)in_RDI[3].m_floats = bVar1.m_floats._8_8_;
  return;
}

Assistant:

void	btQuantizedBvh::setQuantizationValues(const btVector3& bvhAabbMin,const btVector3& bvhAabbMax,btScalar quantizationMargin)
{
	//enlarge the AABB to avoid division by zero when initializing the quantization values
	btVector3 clampValue(quantizationMargin,quantizationMargin,quantizationMargin);
	m_bvhAabbMin = bvhAabbMin - clampValue;
	m_bvhAabbMax = bvhAabbMax + clampValue;
	btVector3 aabbSize = m_bvhAabbMax - m_bvhAabbMin;
	m_bvhQuantization = btVector3(btScalar(65533.0),btScalar(65533.0),btScalar(65533.0)) / aabbSize;

	m_useQuantization = true;

	{
		unsigned short vecIn[3];
		btVector3 v;
		{
			quantize(vecIn,m_bvhAabbMin,false);
			v = unQuantize(vecIn);
			m_bvhAabbMin.setMin(v-clampValue);
		}
		{
			quantize(vecIn,m_bvhAabbMax,true);
			v = unQuantize(vecIn);
			m_bvhAabbMax.setMax(v+clampValue);
		}
		aabbSize = m_bvhAabbMax - m_bvhAabbMin;
		m_bvhQuantization = btVector3(btScalar(65533.0),btScalar(65533.0),btScalar(65533.0)) / aabbSize;
	}
}